

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O3

bool __thiscall
StringKMerFactory::create_kmers
          (StringKMerFactory *this,string *s,
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          *mers)

{
  byte bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint64_t *__args_1;
  ulong uVar5;
  bool *__args;
  undefined1 auStack_38 [7];
  bool local_31;
  
  (this->super_KMerFactory).last_unknown = 0;
  (this->super_KMerFactory).fkmer = 0;
  (this->super_KMerFactory).rkmer = 0;
  _auStack_38 = in_RAX;
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  reserve(mers,((long)(mers->
                      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(mers->
                      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) + s->_M_string_length);
  if (s->_M_string_length != 0) {
    uVar5 = 0;
    do {
      bVar1 = (s->_M_dataplus)._M_p[uVar5];
      lVar3 = (long)(this->super_KMerFactory).b2f._M_elems[bVar1];
      uVar2 = (this->super_KMerFactory).rkmer * 4;
      if (lVar3 == 4) {
        uVar2 = uVar2 & (this->super_KMerFactory).KMER_MASK;
        uVar4 = (3L << ((byte)(this->super_KMerFactory).KMER_FIRSTOFFSET & 0x3f)) +
                ((this->super_KMerFactory).fkmer >> 2);
        lVar3 = 0;
      }
      else {
        uVar2 = uVar2 + lVar3 & (this->super_KMerFactory).KMER_MASK;
        uVar4 = ((long)(this->super_KMerFactory).b2r._M_elems[bVar1] <<
                ((byte)(this->super_KMerFactory).KMER_FIRSTOFFSET & 0x3f)) +
                ((this->super_KMerFactory).fkmer >> 2);
        lVar3 = (this->super_KMerFactory).last_unknown + 1;
      }
      (this->super_KMerFactory).last_unknown = lVar3;
      (this->super_KMerFactory).rkmer = uVar2;
      (this->super_KMerFactory).fkmer = uVar4;
      if ((long)(ulong)(this->super_KMerFactory).K <= lVar3) {
        if (uVar2 < uVar4) {
          auStack_38 = (undefined1  [7])CONCAT16(0,auStack_38._0_6_);
          __args = (bool *)(auStack_38 + 6);
          __args_1 = &(this->super_KMerFactory).rkmer;
        }
        else {
          _auStack_38 = CONCAT17(1,auStack_38);
          __args = (bool *)(auStack_38 + 7);
          __args_1 = &(this->super_KMerFactory).fkmer;
        }
        std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>::
        emplace_back<bool,unsigned_long&>
                  ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                    *)mers,__args,__args_1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < s->_M_string_length);
  }
  return false;
}

Assistant:

const bool create_kmers(const std::string &s, std::vector<std::pair<bool, uint64_t>> &mers) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        mers.reserve(mers.size()+s.size());
        while (p < s.size()) {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(true, fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(false, rkmer);
                }
            }
        }
        return false;
    }